

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script
          (LinkedObjectFile *this,int seg,int word_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  bool bVar1;
  reference this_00;
  reference pvVar2;
  reference pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  LinkedObjectFile *this_01;
  vector<bool,_std::allocator<bool>_> *in_R8;
  uint uVar4;
  reference rVar5;
  shared_ptr<Form> sVar6;
  shared_ptr<Form> fill;
  undefined1 local_60 [16];
  LinkedObjectFile *local_50;
  vector<Label,_std::allocator<Label>_> *local_48;
  size_type local_40;
  vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  *local_38;
  
  this_01 = (LinkedObjectFile *)CONCAT44(in_register_00000034,seg);
  uVar4 = (int)seen * 4 + 2;
  std::make_shared<Form>();
  **(undefined4 **)&this->stats = 7;
  local_50 = this;
  std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_38 = &this_01->words_by_seg;
  local_40 = (size_type)word_idx;
  local_48 = &this_01->labels;
  while( true ) {
    if ((uVar4 & 7) != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x2e3,
                    "std::shared_ptr<Form> LinkedObjectFile::to_form_script(int, int, std::vector<bool> &)"
                   );
    }
    to_form_script_object
              ((LinkedObjectFile *)local_60,seg,word_idx,
               (vector<bool,_std::allocator<bool>_> *)(ulong)(uVar4 - 2));
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pair[0].
                super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    rVar5 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,(long)((int)uVar4 / 4));
    *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
    uVar4 = uVar4 + 2;
    bVar1 = is_empty_list(this_01,word_idx,uVar4);
    if (bVar1) {
      std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)local_60,
                 &gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>);
      goto LAB_0013bb73;
    }
    this_00 = std::
              vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
              ::at(local_38,local_40);
    pvVar2 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                       (this_00,(long)((int)uVar4 >> 2));
    if (pvVar2->kind != PTR) break;
    pvVar3 = std::vector<Label,_std::allocator<Label>_>::at(local_48,(long)pvVar2->label_id);
    if ((pvVar3->offset & 7U) != 2) break;
    pvVar3 = std::vector<Label,_std::allocator<Label>_>::at(local_48,(long)pvVar2->label_id);
    uVar4 = pvVar3->offset;
    std::make_shared<Form>();
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pair[1].
                super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    ((fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pair[1].
     super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kind = PAIR;
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,
               &(fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pair[1].
                super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>);
  }
  to_form_script_object
            ((LinkedObjectFile *)local_60,seg,word_idx,
             (vector<bool,_std::allocator<bool>_> *)(ulong)uVar4);
LAB_0013bb73:
  std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pair[1].
              super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fill.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar6.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_50;
  return (shared_ptr<Form>)sVar6.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script(int seg,
                                                       int word_idx,
                                                       std::vector<bool>& seen) {
  // the object to currently print. to start off, create pair from the car address we've been given.
  int goal_print_obj = word_idx * 4 + 2;

  // resulting form. we can't have a totally empty list (as an empty list looks like a symbol,
  // so it wouldn't be flagged), so it's safe to make this a pair.
  auto result = std::make_shared<Form>();
  result->kind = FormKind::PAIR;

  // the current pair to fill out.
  auto fill = result;

  // loop until we run out of things to add
  for (;;) {
    // check the thing to print is a a pair.
    if ((goal_print_obj & 7) == 2) {
      // first convert the car (again, with (&-> obj car))
      fill->pair[0] = to_form_script_object(seg, goal_print_obj - 2, seen);
      seen.at(goal_print_obj / 4) = true;

      auto cdr_addr = goal_print_obj + 2;

      if (is_empty_list(seg, cdr_addr)) {
        // the list has ended!
        fill->pair[1] = gSymbolTable.getEmptyPair();
        return result;
      } else {
        // cdr object should be aligned.
        assert((cdr_addr % 4) == 0);
        auto& cdr_word = words_by_seg.at(seg).at(cdr_addr / 4);
        // check for proper list
        if (cdr_word.kind == LinkedWord::PTR && (labels.at(cdr_word.label_id).offset & 7) == 2) {
          // yes, proper list. add another pair and link it in to the list.
          goal_print_obj = labels.at(cdr_word.label_id).offset;
          fill->pair[1] = std::make_shared<Form>();
          fill->pair[1]->kind = FormKind::PAIR;
          fill = fill->pair[1];
        } else {
          // improper list, put the last thing in and end
          fill->pair[1] = to_form_script_object(seg, cdr_addr, seen);
          return result;
        }
      }
    } else {
      // improper list, should be impossible to get here because of earlier checks
      assert(false);
    }
  }

  return result;
}